

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

int detectSwitch(istream *in)

{
  uchar auVar1 [4];
  uchar auVar2 [4];
  int iVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  bool bVar6;
  little_int32_buf_t buf [2];
  
  std::istream::seekg((long)in,_S_beg);
  auVar2 = (uchar  [4])std::istream::tellg();
  std::istream::seekg((long)in,4);
  std::istream::read((char *)in,(long)buf);
  std::istream::seekg((long)in,_S_beg);
  if ((buf[1].value_ != auVar2) &&
     (auVar1[0] = 0xff, auVar1[1] = 0xff, auVar1[2] = 0xff, auVar1[3] = 0xff,
     bVar6 = buf[0].value_ != auVar2, buf[0].value_ = auVar1, bVar6)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to autodetect file type of ");
    pbVar5 = std::filesystem::__cxx11::operator<<(poVar4,&currentFileName_abi_cxx11_);
    poVar4 = std::operator<<(pbVar5,", guessing PS3");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  iVar3._0_1_ = buf[0].value_[0];
  iVar3._1_1_ = buf[0].value_[1];
  iVar3._2_1_ = buf[0].value_[2];
  iVar3._3_1_ = buf[0].value_[3];
  return iVar3;
}

Assistant:

static int detectSwitch(std::istream &in) {
	in.seekg(0, in.end);
	int size = in.tellg();
	in.seekg(4, in.beg);
	boost::endian::little_int32_buf_t buf[2];
	in.read((char *)buf, sizeof(buf));
	in.seekg(0, in.beg);
	if (buf[1].value() == size) {
		return buf[0].value();
	}
	else {
		if (buf[0].value() != size) {
			std::cerr << "Failed to autodetect file type of " << currentFileName << ", guessing PS3" << std::endl;
		}
		return -1;
	}
}